

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t ulocimp_getCountry_63(char *localeID,char *country,int32_t countryCapacity,char **pEnd)

{
  byte c;
  char *pcVar1;
  bool bVar2;
  char cVar3;
  ushort uVar4;
  size_t sVar5;
  int32_t iVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char cnty [4];
  char local_3c [4];
  char **local_38;
  
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  uVar10 = 0;
  while( true ) {
    c = localeID[uVar10];
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    if (uVar10 < 3) {
      cVar3 = uprv_toupper_63(c);
      local_3c[uVar10] = cVar3;
    }
    uVar10 = uVar10 + 1;
  }
  iVar6 = 0;
  if (((uint)uVar10 & 0x7ffffffe) == 2) {
    local_38 = pEnd;
    if (uVar10 == 3) {
      uVar4 = _findIndex(COUNTRIES_3,local_3c);
      if ((short)uVar4 < 0) {
        bVar2 = true;
        uVar10 = 3;
      }
      else {
        pcVar1 = COUNTRIES[uVar4];
        cVar3 = *pcVar1;
        pcVar9 = pcVar1;
        if (cVar3 != '\0') {
          lVar8 = 0;
          iVar6 = countryCapacity;
          do {
            if (iVar6 < 1) {
              sVar5 = strlen(pcVar1 + lVar8);
              uVar10 = lVar8 + sVar5;
              goto LAB_002b9e52;
            }
            country[lVar8] = cVar3;
            iVar6 = iVar6 + -1;
            cVar3 = pcVar1[lVar8 + 1];
            lVar8 = lVar8 + 1;
          } while (cVar3 != '\0');
          pcVar9 = pcVar1 + lVar8;
        }
        uVar10 = (long)pcVar9 - (long)pcVar1;
LAB_002b9e52:
        bVar2 = false;
      }
    }
    else {
      bVar2 = true;
      uVar10 = uVar10 & 0xffffffff;
    }
    iVar6 = (int32_t)uVar10;
    if ((bVar2) && (0 < iVar6)) {
      uVar7 = 0;
      do {
        if ((long)uVar7 < (long)countryCapacity) {
          cVar3 = uprv_toupper_63(localeID[uVar7]);
          country[uVar7] = cVar3;
        }
        uVar7 = uVar7 + 1;
      } while ((uVar10 & 0xffffffff) != uVar7);
    }
    localeID = localeID + iVar6;
    pEnd = local_38;
  }
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  return iVar6;
}

Assistant:

U_CFUNC int32_t
ulocimp_getCountry(const char *localeID,
                   char *country, int32_t countryCapacity,
                   const char **pEnd)
{
    int32_t idLen=0;
    char cnty[ULOC_COUNTRY_CAPACITY]={ 0, 0, 0, 0 };
    int32_t offset;

    /* copy the country as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])) {
        if(idLen<(ULOC_COUNTRY_CAPACITY-1)) {   /*CWB*/
            cnty[idLen]=(char)uprv_toupper(localeID[idLen]);
        }
        idLen++;
    }

    /* the country should be either length 2 or 3 */
    if (idLen == 2 || idLen == 3) {
        UBool gotCountry = FALSE;
        /* convert 3 character code to 2 character code if possible *CWB*/
        if(idLen==3) {
            offset=_findIndex(COUNTRIES_3, cnty);
            if(offset>=0) {
                idLen=_copyCount(country, countryCapacity, COUNTRIES[offset]);
                gotCountry = TRUE;
            }
        }
        if (!gotCountry) {
            int32_t i = 0;
            for (i = 0; i < idLen; i++) {
                if (i < countryCapacity) {
                    country[i]=(char)uprv_toupper(localeID[i]);
                }
            }
        }
        localeID+=idLen;
    } else {
        idLen = 0;
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }

    return idLen;
}